

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

nh_msgtype_rules * parse_msgtype_rules(char *str)

{
  char *__ptr;
  size_t sVar1;
  bool local_c9 [9];
  char pattern [121];
  int local_40;
  int local_3c;
  int rcount;
  int i;
  char *start;
  char *copy;
  char *semi;
  nh_msgtype_rules *out;
  char *str_local;
  
  if ((str == (char *)0x0) || (*str == '\0')) {
    str_local = (char *)0x0;
  }
  else {
    local_40 = 0;
    _rcount = str;
    while( true ) {
      _rcount = strchr(_rcount,0x3b);
      if (_rcount == (char *)0x0) break;
      local_40 = local_40 + 1;
      _rcount = _rcount + 1;
    }
    if (local_40 == 0) {
      str_local = (char *)0x0;
    }
    else {
      mt_rules_static.num_rules = local_40;
      mt_rules_static.rules = mt_rules_array;
      __ptr = strdup(str);
      local_3c = 0;
      copy = (char *)0x0;
      _rcount = __ptr;
      while( true ) {
        local_c9[0] = false;
        if (local_3c < local_40) {
          copy = strchr(_rcount,0x3b);
          local_c9[0] = copy != (char *)0x0;
        }
        if (local_c9[0] == false) break;
        *copy = '\0';
        __isoc99_sscanf(_rcount,"(\"%120[^|]|%u)",(long)local_c9 + 1,
                        &mt_rules_static.rules[local_3c].action);
        sVar1 = strlen((char *)((long)local_c9 + 1));
        local_c9[sVar1] = false;
        strcpy(mt_rules_static.rules[local_3c].pattern,(char *)((long)local_c9 + 1));
        _rcount = copy + 1;
        local_3c = local_3c + 1;
      }
      free(__ptr);
      str_local = (char *)&mt_rules_static;
    }
  }
  return (nh_msgtype_rules *)str_local;
}

Assistant:

struct nh_msgtype_rules *parse_msgtype_rules(const char *str)
{
    struct nh_msgtype_rules *out;
    char *semi, *copy;
    const char *start;
    int i, rcount;

    if (!str || !*str)
	return NULL;

    /* Count number of rules based on number of semicolons. */
    rcount = 0;
    start = str;
    while ((semi = strchr(start, ';'))) {
	rcount++;
	start = semi + 1;
    }
    if (rcount == 0)
	return NULL;

    out = &mt_rules_static;
    out->num_rules = rcount;
    out->rules = mt_rules_array;

    /* Parse the rules. */
    copy = strdup(str);
    start = copy;
    for (i = 0; i < rcount && (semi = strchr(start, ';')); i++) {
	/* Big enough for the pattern, extra " and null terminator. */
	char pattern[121];

	*semi = '\0';
	sscanf(start, "(\"%120[^|]|%u)", pattern, &out->rules[i].action);
	/* Remove extra " at the end of the %[ match. */
	pattern[strlen(pattern) - 1] = '\0';
	strcpy(out->rules[i].pattern, pattern);

	start = semi + 1;
    }
    free(copy);

    return out;
}